

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O2

bool glslang::TDefaultIoResolverBase::isImageType(TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*type->_vptr_TType[7])();
  if (iVar2 == 0xe) {
    iVar2 = (*type->_vptr_TType[8])(type);
    bVar1 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar2));
    return bVar1;
  }
  return false;
}

Assistant:

static bool isImageType(const glslang::TType& type) {
        return type.getBasicType() == glslang::EbtSampler && type.getSampler().isImage();
    }